

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

int mpc_test_fail(mpc_parser_t *p,char *s,void *d,_func_int_void_ptr_void_ptr *tester,
                 mpc_dtor_t destructor,_func_void_void_ptr *printer)

{
  int iVar1;
  code *in_RCX;
  char *in_RDX;
  mpc_parser_t *in_R8;
  mpc_result_t *in_R9;
  mpc_result_t r;
  mpc_err_t *in_stack_ffffffffffffffc0;
  undefined4 local_4;
  
  iVar1 = mpc_parse(in_RDX,(char *)in_RCX,in_R8,in_R9);
  if (iVar1 == 0) {
    mpc_err_delete(in_stack_ffffffffffffffc0);
    local_4 = 1;
  }
  else {
    iVar1 = (*in_RCX)(in_stack_ffffffffffffffc0,in_RDX);
    if (iVar1 == 0) {
      (*(code *)in_R8)(in_stack_ffffffffffffffc0);
      local_4 = 1;
    }
    else {
      (*(code *)in_R8)(in_stack_ffffffffffffffc0);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int mpc_test_fail(mpc_parser_t *p, const char *s, const void *d,
  int(*tester)(const void*, const void*),
  mpc_dtor_t destructor,
  void(*printer)(const void*)) {
  mpc_result_t r;
  (void) printer;
  if (mpc_parse("<test>", s, p, &r)) {

    if (tester(r.output, d)) {
      destructor(r.output);
      return 0;
    } else {
      destructor(r.output);
      return 1;
    }

  } else {
    mpc_err_delete(r.error);
    return 1;
  }

}